

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Own<kj::Directory::Replacer<kj::File>,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskDirectory::replaceFile(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  Own<kj::Directory::Replacer<kj::File>,_std::nullptr_t> OVar1;
  PathPtr path_00;
  WriteMode mode_local;
  DiskDirectory *this_local;
  PathPtr path_local;
  
  path_00.parts.size_ = path.parts.size_;
  path_00.parts.ptr = &((path.parts.ptr)->content).size_;
  OVar1 = DiskHandle::replaceFile((DiskHandle *)this,path_00,mode);
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<Replacer<File>> replaceFile(PathPtr path, WriteMode mode) const override {
    return DiskHandle::replaceFile(path, mode);
  }